

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

PArray * NewArray(PType *type,uint count)

{
  PClass *len;
  PArray *local_28;
  PType *atype;
  size_t bucket;
  PType *pPStack_10;
  uint count_local;
  PType *type_local;
  
  len = PArray::RegistrationInfo.MyClass;
  bucket._4_4_ = count;
  pPStack_10 = type;
  local_28 = (PArray *)
             FTypeTable::FindType
                       (&TypeTable,PArray::RegistrationInfo.MyClass,(intptr_t)type,(ulong)count,
                        (size_t *)&atype);
  if (local_28 == (PArray *)0x0) {
    local_28 = (PArray *)DObject::operator_new((DObject *)0xa8,(size_t)len);
    PArray::PArray(local_28,pPStack_10,bucket._4_4_);
    FTypeTable::AddType(&TypeTable,(PType *)local_28,PArray::RegistrationInfo.MyClass,
                        (intptr_t)pPStack_10,(ulong)bucket._4_4_,(size_t)atype);
  }
  return local_28;
}

Assistant:

PArray *NewArray(PType *type, unsigned int count)
{
	size_t bucket;
	PType *atype = TypeTable.FindType(RUNTIME_CLASS(PArray), (intptr_t)type, count, &bucket);
	if (atype == NULL)
	{
		atype = new PArray(type, count);
		TypeTable.AddType(atype, RUNTIME_CLASS(PArray), (intptr_t)type, count, bucket);
	}
	return (PArray *)atype;
}